

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_> *
__thiscall sf::String::toUtf16_abi_cxx11_(String *this)

{
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  output_00;
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  in_RSI;
  __normal_iterator<const_unsigned_int_*,_std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  in_RDI;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  *output;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff88;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff98;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  *this_00;
  
  this_00 = (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
             *)in_RDI._M_current;
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  basic_string((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                *)in_RDI._M_current);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::length
            ((basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
              *)in_RSI._M_current);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  reserve(this_00,(size_type)in_RSI._M_current);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::begin
            (in_stack_ffffffffffffff88);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::end
            (in_stack_ffffffffffffff98);
  output_00 = std::
              back_inserter<std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>
                        ((basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
                          *)in_stack_ffffffffffffff88);
  Utf<32u>::
  toUtf16<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::__cxx11::basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>
            (in_RSI,in_RDI,output_00);
  return (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
          *)in_RDI._M_current;
}

Assistant:

std::basic_string<Uint16> String::toUtf16() const
{
    // Prepare the output string
    std::basic_string<Uint16> output;
    output.reserve(m_string.length());

    // Convert
    Utf32::toUtf16(m_string.begin(), m_string.end(), std::back_inserter(output));

    return output;
}